

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O2

Var Js::DataView::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  uint32 offset;
  uint uVar6;
  undefined4 *puVar7;
  Var pvVar8;
  Var aValue;
  ArrayBufferBase *arrayBuffer;
  DataView *obj;
  RecyclableObject *constructor;
  char16 *varName;
  uint32 length;
  int in_stack_00000010;
  Arguments local_68;
  Var local_58;
  CallInfo local_50;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x10,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a1385f;
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_50,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((callInfo_local._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x13,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar3) {
LAB_00a1385f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  pvVar8 = Arguments::GetNewTarget((Arguments *)&callInfo_local);
  bVar3 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_68);
  if (((ulong)local_50 & 0x1000000) == 0) {
LAB_00a1384b:
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea00,L"DataView");
  }
  if (pvVar8 != (Var)0x0) {
    BVar5 = JavascriptOperators::IsUndefinedObject(pvVar8);
    if (BVar5 != 0) goto LAB_00a1384b;
  }
  if ((callInfo_local._0_4_ & 0xfffffe) == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec20,L"buffer");
  }
  aValue = Arguments::operator[]((Arguments *)&callInfo_local,1);
  bVar4 = VarIs<Js::ArrayBufferBase>(aValue);
  if (!bVar4) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea1c,L"buffer");
  }
  local_58 = pvVar8;
  pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  arrayBuffer = VarTo<Js::ArrayBufferBase>(pvVar8);
  offset = 0;
  if (2 < (callInfo_local._0_4_ & 0xffffff)) {
    pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,2);
    offset = ArrayBuffer::ToIndex(pvVar8,-0x7ff5ec5b,pSVar1,0x7fffffff,false);
  }
  if (arrayBuffer->isDetached != true) {
    uVar6 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(arrayBuffer);
    length = uVar6 - offset;
    if (uVar6 < offset) {
      varName = L"byteOffset";
LAB_00a13890:
      JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec1e,varName);
    }
    if ((callInfo_local._0_4_ & 0xfffffc) != 0) {
      pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,3);
      BVar5 = JavascriptOperators::IsUndefinedObject(pvVar8);
      if (BVar5 == 0) {
        pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,3);
        length = ArrayBuffer::ToIndex(pvVar8,-0x7ff5ec5b,pSVar1,0x7fffffff,false);
        if ((uVar6 < length + offset) || (CARRY4(length,offset))) {
          varName = L"byteLength";
          goto LAB_00a13890;
        }
      }
    }
    if (arrayBuffer->isDetached != true) {
      obj = JavascriptLibrary::CreateDataView
                      ((pSVar1->super_ScriptContextBase).javascriptLibrary,arrayBuffer,offset,length
                      );
      if (bVar3) {
        constructor = VarTo<Js::RecyclableObject>(local_58);
        obj = (DataView *)
              JavascriptOperators::OrdinaryCreateFromConstructor
                        (constructor,(RecyclableObject *)obj,(DynamicObject *)0x0,pSVar1);
      }
      return obj;
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ebe5,(PCWSTR)0x0);
}

Assistant:

Var DataView::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);
        uint32 byteLength = 0;
        uint32 mappedLength;
        int32 offset = 0;
        ArrayBufferBase* arrayBuffer = nullptr;
        DataView* dataView;

        //1.    If NewTarget is undefined, throw a TypeError exception.
        if (!(callInfo.Flags & CallFlags_New) || (newTarget && JavascriptOperators::IsUndefinedObject(newTarget)))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("DataView"));
        }

        if (args.Info.Count < 2)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DataView_NeedArgument, _u("buffer"));
        }

        //2.    If Type(buffer) is not Object, throw a TypeError exception.
        //3.    If buffer does not have an [[ArrayBufferData]] internal slot, throw a TypeError exception.
        if (arrayBuffer == nullptr)
        {
            if (VarIs<ArrayBufferBase>(args[1]))
            {
                arrayBuffer = VarTo<ArrayBufferBase>(args[1]);
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedArrayBufferObject, _u("buffer"));
            }
        }

        //4.    Let offset be ToIndex(byteOffset).
        if (args.Info.Count > 2)
        {
            Var secondArgument = args[2];
            offset = ArrayBuffer::ToIndex(secondArgument, JSERR_ArrayLengthConstructIncorrect, scriptContext, ArrayBuffer::MaxArrayBufferLength, false);
        }

        //5.    If IsDetachedBuffer(buffer) is true, throw a TypeError exception.
        if (arrayBuffer->IsDetached())
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray);
        }

        //6.    Let bufferByteLength be the value of buffer's[[ArrayBufferByteLength]] internal slot.
        //7.   If offset > bufferByteLength, throw a RangeError exception.
        byteLength = arrayBuffer->GetByteLength();
        if ((uint32)offset > byteLength)
        {
            JavascriptError::ThrowRangeError(
                scriptContext, JSERR_DataView_InvalidArgument, _u("byteOffset"));
        }

        //8.   If byteLength is either not present or is undefined, then
        //      a.  Let viewByteLength be bufferByteLength - offset.
        //9.   Else,
        //      a.  Let viewByteLength be ToIndex(byteLength).
        //      b.  If offset + viewByteLength > bufferByteLength, throw a RangeError exception.
        if (args.Info.Count > 3 && !JavascriptOperators::IsUndefinedObject(args[3]))
        {
            Var thirdArgument = args[3];
            mappedLength = ArrayBuffer::ToIndex(thirdArgument, JSERR_ArrayLengthConstructIncorrect, scriptContext, ArrayBuffer::MaxArrayBufferLength, false);
            uint32 viewRange = mappedLength + offset;

            if (viewRange > byteLength || viewRange < mappedLength) // overflow indicates out-of-range
            {
                JavascriptError::ThrowRangeError(
                    scriptContext, JSERR_DataView_InvalidArgument, _u("byteLength"));
            }
        }
        else
        {
            mappedLength = byteLength - offset;
        }

        // Evaluation of the argument(s) above is reentrant and can detach the array.
        if (arrayBuffer->IsDetached())
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray);
        }

        //10.   Let O be OrdinaryCreateFromConstructor(NewTarget, "%DataViewPrototype%", [[DataView]], [[ViewedArrayBuffer]], [[ByteLength]], [[ByteOffset]]).
        //11.   Set O's[[DataView]] internal slot to true.
        //12.   Set O's[[ViewedArrayBuffer]] internal slot to buffer.
        //13.   Set O's[[ByteLength]] internal slot to viewByteLength.
        //14.   Set O's[[ByteOffset]] internal slot to offset.
        //15.   Return O.
        dataView = scriptContext->GetLibrary()->CreateDataView(arrayBuffer, offset, mappedLength);
        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), dataView, nullptr, scriptContext) :
            dataView;
    }